

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::handleProvide(capnp::rpc::Provide::Reader_const&)::
ProvidePipelineHook::getPipelinedCap(kj::Array<capnp::PipelineOp>___
          (void *this,Array<capnp::PipelineOp> *ops)

{
  char (*in_RCX) [38];
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar1;
  String local_1c8;
  Exception local_1b0;
  Array<capnp::PipelineOp> *ops_local;
  ProvidePipelineHook *this_local;
  
  ops_local = ops;
  this_local = (ProvidePipelineHook *)this;
  kj::_::Debug::makeDescription<char_const(&)[38]>
            (&local_1c8,(Debug *)"\"can\'t pipeline on a Provide operation\"",
             "can\'t pipeline on a Provide operation",in_RCX);
  kj::Exception::Exception
            (&local_1b0,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,0x1144,&local_1c8);
  newBrokenCap((capnp *)this,&local_1b0);
  kj::Exception::~Exception(&local_1b0);
  kj::String::~String(&local_1c8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::Array<PipelineOp>&& ops) override {
        return newBrokenCap(KJ_EXCEPTION(FAILED, "can't pipeline on a Provide operation"));
      }